

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoBodies.cpp
# Opt level: O3

void __thiscall chrono::ChConstraintTwoBodies::Update_auxiliary(ChConstraintTwoBodies *this)

{
  double dVar1;
  ChVariables *pCVar2;
  double dVar3;
  
  pCVar2 = (this->super_ChConstraintTwo).variables_a;
  if (pCVar2->disabled == false) {
    (*pCVar2->_vptr_ChVariables[4])();
  }
  pCVar2 = (this->super_ChConstraintTwo).variables_b;
  if (pCVar2->disabled == false) {
    (*pCVar2->_vptr_ChVariables[4])();
  }
  (this->super_ChConstraintTwo).super_ChConstraint.g_i = 0.0;
  dVar3 = 0.0;
  if (((this->super_ChConstraintTwo).variables_a)->disabled == false) {
    dVar3 = (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[0] *
            (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
            m_data.array[0] +
            (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[2] *
            (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
            m_data.array[2] +
            (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[4] *
            (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
            m_data.array[4] +
            (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[1] *
            (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
            m_data.array[1] +
            (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[3] *
            (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
            m_data.array[3] +
            (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[5] *
            (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
            m_data.array[5] + 0.0;
    (this->super_ChConstraintTwo).super_ChConstraint.g_i = dVar3;
  }
  if (((this->super_ChConstraintTwo).variables_b)->disabled == false) {
    dVar3 = dVar3 + (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                    m_storage.m_data.array[0] *
                    (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                    m_storage.m_data.array[0] +
                    (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                    m_storage.m_data.array[2] *
                    (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                    m_storage.m_data.array[2] +
                    (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                    m_storage.m_data.array[4] *
                    (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                    m_storage.m_data.array[4] +
                    (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                    m_storage.m_data.array[1] *
                    (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                    m_storage.m_data.array[1] +
                    (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                    m_storage.m_data.array[3] *
                    (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                    m_storage.m_data.array[3] +
                    (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                    m_storage.m_data.array[5] *
                    (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                    m_storage.m_data.array[5];
    (this->super_ChConstraintTwo).super_ChConstraint.g_i = dVar3;
  }
  dVar1 = (this->super_ChConstraintTwo).super_ChConstraint.cfm_i;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    (this->super_ChConstraintTwo).super_ChConstraint.g_i = dVar1 + dVar3;
  }
  return;
}

Assistant:

void ChConstraintTwoBodies::Update_auxiliary() {
    // 1- Assuming jacobians are already computed, now compute
    //   the matrices [Eq_a]=[invM_a]*[Cq_a]' and [Eq_b]
    if (variables_a->IsActive()) {
        variables_a->Compute_invMb_v(Eq_a, Cq_a.transpose());
    }
    if (variables_b->IsActive()) {
        variables_b->Compute_invMb_v(Eq_b, Cq_b.transpose());
    }

    // 2- Compute g_i = [Cq_i]*[invM_i]*[Cq_i]' + cfm_i
    g_i = 0;
    if (variables_a->IsActive()) {
        g_i += Cq_a * Eq_a;
    }
    if (variables_b->IsActive()) {
        g_i += Cq_b * Eq_b;
    }

    // 3- adds the constraint force mixing term (usually zero):
    if (cfm_i)
        g_i += cfm_i;
}